

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

bool exists(v_array<unsigned_long> db)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = (long)db._end - (long)db._begin;
  if (lVar2 != 0) {
    uVar3 = lVar2 >> 3;
    if (*db._begin == 0) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar3 + (uVar3 == 0) == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (db._begin[uVar4] == 0);
      return uVar4 < uVar3;
    }
  }
  return lVar2 != 0;
}

Assistant:

bool exists(v_array<size_t> db)
{
  for (size_t i = 0; i < db.size(); i++)
    if (db[i] != 0)
      return true;
  return false;
}